

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O1

void __thiscall
Assimp::STEP::LazyObject::LazyObject
          (LazyObject *this,DB *db,uint64_t id,uint64_t param_3,char *type,char *args)

{
  _Rb_tree_header *p_Var1;
  Assimp AVar2;
  _Base_ptr max_inout;
  _Base_ptr p_Var3;
  Assimp *this_00;
  long lVar4;
  char *tmp;
  pair<unsigned_long,_unsigned_long> local_38;
  
  this->id = id;
  this->type = type;
  this->db = db;
  this->args = args;
  this->obj = (Object *)0x0;
  p_Var1 = &(db->inv_whitelist)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (db->inv_whitelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  max_inout = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(char **)(p_Var3 + 1) < type]) {
    if (*(char **)(p_Var3 + 1) >= type) {
      max_inout = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)max_inout != p_Var1) &&
     (p_Var3 = max_inout, type < *(char **)(max_inout + 1))) {
    max_inout = &p_Var1->_M_header;
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    return;
  }
  lVar4 = 0;
  do {
    AVar2 = (Assimp)*args;
    if (AVar2 == (Assimp)0x28) {
      lVar4 = lVar4 + 1;
    }
    else if (AVar2 == (Assimp)0x29) {
      lVar4 = lVar4 + -1;
    }
    else if (AVar2 == (Assimp)0x0) {
      return;
    }
    this_00 = (Assimp *)args;
    if (((AVar2 == (Assimp)0x23) && (0 < lVar4)) &&
       (this_00 = (Assimp *)args + 1, ((Assimp *)args)[1] != (Assimp)0x23)) {
      local_38.first = strtoul10_64(this_00,(char *)&local_38,(char **)0x0,&max_inout->_M_color);
      local_38.second = id;
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
      ::_M_emplace_equal<std::pair<unsigned_long,unsigned_long>>
                ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                  *)&db->refs,&local_38);
      this_00 = (Assimp *)args;
    }
    args = (char *)(this_00 + 1);
  } while( true );
}

Assistant:

STEP::LazyObject::LazyObject(DB& db, uint64_t id,uint64_t /*line*/, const char* const type,const char* args)
: id(id)
, type(type)
, db(db)
, args(args)
, obj() {
    // find any external references and store them in the database.
    // this helps us emulate STEPs INVERSE fields.
    if (!db.KeepInverseIndicesForType(type)) {
        return;
    }

    // do a quick scan through the argument tuple and watch out for entity references
    const char *a( args );
    int64_t skip_depth( 0 );
    while ( *a ) {
        handleSkippedDepthFromToken(a, skip_depth);
        /*if (*a == '(') {
            ++skip_depth;
        } else if (*a == ')') {
            --skip_depth;
        }*/

		if (skip_depth >= 1 && *a=='#') {
			if (*(a + 1) != '#') {
				/*const char *tmp;
				const int64_t num = static_cast<int64_t>(strtoul10_64(a + 1, &tmp));
				db.MarkRef(num, id);*/
                db.MarkRef(getIdFromToken(a), id);
			} else {
				++a;
			}
        }
        ++a;
    }
}